

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::BindVertexBufferCase::iterate(BindVertexBufferCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint index;
  int height;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  RenderTarget *pRVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  PixelBufferAccess local_240;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  MessageBuilder local_1f8;
  GLenum local_74;
  undefined1 local_70 [4];
  deUint32 error;
  VertexArray vao;
  Surface dst;
  undefined1 local_28 [4];
  deInt32 positionLoc;
  CallLogWrapper gl;
  BindVertexBufferCase *this_local;
  
  gl._16_8_ = this;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  index = glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_28,dVar2,"a_position");
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar6);
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  height = tcu::RenderTarget::getHeight(pRVar6);
  tcu::Surface::Surface((Surface *)&vao.super_ObjectWrapper.m_object,iVar1,height);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_70,pRVar4);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)local_28,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)local_28,0x4000);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x248);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_28,dVar2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x24b);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_70);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_28,dVar2);
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_28,index);
  glu::CallLogWrapper::glVertexAttribFormat((CallLogWrapper *)local_28,index,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_28,index,0);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)local_28,0,this->m_buffer,(long)this->m_offset,0x10);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"set buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x252);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)local_28,0,0,this->m_drawCount);
  local_74 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  if (local_74 != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [12])0x2b45da6);
    EVar8 = glu::getErrorStr(local_74);
    local_218 = EVar8.m_getName;
    local_210 = EVar8.m_value;
    local_208.m_getName = local_218;
    local_208.m_value = local_210;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_208);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", ignoring...");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
  }
  glu::CallLogWrapper::glFinish((CallLogWrapper *)local_28);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_240,(Surface *)&vao.super_ObjectWrapper.m_object);
  glu::readPixels(pRVar4,0,0,&local_240);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_70);
  tcu::Surface::~Surface((Surface *)&vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
  return STOP;
}

Assistant:

BindVertexBufferCase::IterateResult BindVertexBufferCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const deInt32			positionLoc = gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			dst			(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	glu::VertexArray		vao			(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	gl.glBindVertexArray(*vao);
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribBinding(positionLoc, 0);
	gl.glBindVertexBuffer(0, m_buffer, m_offset, int(sizeof(tcu::Vec4)));
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set buffer");

	gl.glDrawArrays(GL_POINTS, 0, m_drawCount);

	// allow errors after attempted out-of-bounds memory access
	{
		const deUint32 error = gl.glGetError();

		if (error != GL_NO_ERROR)
			m_testCtx.getLog() << tcu::TestLog::Message << "Got error: " << glu::getErrorStr(error) << ", ignoring..." << tcu::TestLog::EndMessage;
	}

	// read pixels to wait for rendering
	gl.glFinish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}